

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int is_commutative(int insn_code)

{
  undefined4 in_EDI;
  int local_4;
  
  switch(in_EDI) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0x28:
  case 0x2a:
  case 0x2b:
    local_4 = 1;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 0x29:
  case 0x2c:
  case 0x2d:
    local_4 = 0;
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0x2e:
  case 0x2f:
    local_4 = 1;
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x30:
  case 0x31:
    local_4 = 0;
    break;
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    local_4 = 1;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    local_4 = 0;
    break;
  default:
    printf("Unknown opcode in is_commutative\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
is_commutative(int insn_code)
{
    switch (insn_code) {
    case dill_jmp_addi:
    case dill_jmp_addu:
    case dill_jmp_addul:
    case dill_jmp_addl:
    case dill_jmp_addp:
    case dill_jmp_addf:
    case dill_jmp_addd:
        return 1;
    case dill_jmp_subi:
    case dill_jmp_subu:
    case dill_jmp_subul:
    case dill_jmp_subl:
    case dill_jmp_subp:
    case dill_jmp_subf:
    case dill_jmp_subd:
        return 0;
    case dill_jmp_muli:
    case dill_jmp_mulu:
    case dill_jmp_mulul:
    case dill_jmp_mull:
    case dill_jmp_mulf:
    case dill_jmp_muld:
        return 1;
    case dill_jmp_divi:
    case dill_jmp_divu:
    case dill_jmp_divul:
    case dill_jmp_divl:
    case dill_jmp_divf:
    case dill_jmp_divd:
    case dill_jmp_modi:
    case dill_jmp_modu:
    case dill_jmp_modul:
    case dill_jmp_modl:
        return 0;
    case dill_jmp_xori:
    case dill_jmp_xoru:
    case dill_jmp_xorul:
    case dill_jmp_xorl:
    case dill_jmp_andi:
    case dill_jmp_andu:
    case dill_jmp_andul:
    case dill_jmp_andl:
    case dill_jmp_ori:
    case dill_jmp_oru:
    case dill_jmp_orul:
    case dill_jmp_orl:
        return 1;
    case dill_jmp_lshi:
    case dill_jmp_lshu:
    case dill_jmp_lshul:
    case dill_jmp_lshl:
    case dill_jmp_rshi:
    case dill_jmp_rshu:
    case dill_jmp_rshul:
    case dill_jmp_rshl:
        return 0;
    default:
        printf("Unknown opcode in is_commutative\n");
        return 0;
    }
}